

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O1

double sdf::SDF(Vector3d *location,
               vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives)

{
  double dVar1;
  double dVar2;
  operation_t oVar3;
  Primitive *pPVar4;
  pointer ppPVar5;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar6;
  double extraout_XMM0_Qa_02;
  SrcEvaluatorType srcEvaluator;
  Transform<double,_3,_2,_0> res;
  Vector3d location_warped;
  double local_130;
  assign_op<double,_double> local_121;
  Vector3d *local_120;
  Matrix<double,_4,_4,_0,_4,_4> local_118;
  undefined1 local_98 [16];
  Affine3d *local_88;
  variable_if_dynamic<long,__1> local_80;
  variable_if_dynamic<long,__1> vStack_78;
  Index local_70;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false> local_60;
  
  ppPVar5 = (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar5 ==
      (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_130 = 0.0;
  }
  else {
    local_130 = 0.0;
    local_120 = location;
    do {
      pPVar4 = *ppPVar5;
      local_98._0_8_ = &pPVar4->transformation;
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      local_80.m_value = 0;
      vStack_78.m_value = 0;
      local_70 = 4;
      local_60.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>,_1>.
      super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>,_0>.m_data =
           (PointerType)&local_118;
      local_60.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_startRow.
      m_value = 0;
      local_60.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_startCol.
      m_value = 0;
      local_60.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_outerStride =
           4;
      local_88 = (Affine3d *)local_98._0_8_;
      local_60.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>.
      super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.m_xpr =
           (XprTypeNested)
           local_60.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_Eigen::Dense>
           .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false,_true>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>,_1>.
           super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>,_0>.m_data;
      Eigen::internal::
      Assignment<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>,_Eigen::Inverse<Eigen::Block<const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_3,_3,_false>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
      ::run(&local_60,(SrcXprType *)local_98,&local_121);
      dVar6 = (pPVar4->transformation).m_matrix.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
              [0xc];
      dVar1 = (pPVar4->transformation).m_matrix.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
              [0xd];
      dVar2 = (pPVar4->transformation).m_matrix.
              super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
              [0xe];
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xc] = (dVar6 * -local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[0] -
              dVar1 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[4]) -
              dVar2 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[8];
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xd] = (dVar6 * -local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                        m_storage.m_data.array[1] -
              dVar1 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[5]) -
              dVar2 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[9];
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xe] = (-local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[10] * dVar2 -
              dVar1 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[6]) -
              dVar6 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                      m_storage.m_data.array[2];
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [3] = 0.0;
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [7] = 0.0;
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xb] = 0.0;
      local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
      [0xf] = 1.0;
      dVar1 = (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
      dVar2 = (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
      dVar6 = (local_120->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
      local_98._0_8_ =
           dVar6 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[8] +
           dVar2 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4] +
           dVar1 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0] +
           local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xc];
      local_98._8_8_ =
           dVar6 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[9] +
           dVar2 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[5] +
           dVar1 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1] +
           local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
           array[0xd];
      local_88 = (Affine3d *)
                 (dVar6 * local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                          m_storage.m_data.array[10] +
                  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[6] * dVar2 +
                  local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array[2] * dVar1 +
                 local_118.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                 m_data.array[0xe]);
      pPVar4 = *ppPVar5;
      if (ppPVar5 ==
          (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
          _M_impl.super__Vector_impl_data._M_start) {
        (**pPVar4->_vptr_Primitive)(pPVar4,(SrcXprType *)local_98);
        local_130 = extraout_XMM0_Qa_00;
      }
      else {
        oVar3 = pPVar4->operation;
        if (oVar3 == bool_intersection) {
          (**pPVar4->_vptr_Primitive)(pPVar4,(SrcXprType *)local_98);
          dVar6 = extraout_XMM0_Qa_02;
        }
        else {
          if (oVar3 != bool_subtraction) {
            if ((oVar3 == bool_union) &&
               ((**pPVar4->_vptr_Primitive)(pPVar4,(SrcXprType *)local_98),
               extraout_XMM0_Qa <= local_130)) {
              local_130 = extraout_XMM0_Qa;
            }
            goto LAB_001045d4;
          }
          (**pPVar4->_vptr_Primitive)(pPVar4,(SrcXprType *)local_98);
          dVar6 = -extraout_XMM0_Qa_01;
        }
        if (local_130 <= dVar6) {
          local_130 = dVar6;
        }
      }
LAB_001045d4:
      ppPVar5 = ppPVar5 + 1;
    } while (ppPVar5 !=
             (primitives->super__Vector_base<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return local_130;
}

Assistant:

double 
  SDF(const Eigen::Vector3d &location, const std::vector<Primitive*> &primitives)
  {
    double d_value = 0.0;

    for(std::vector<Primitive*>::const_iterator it = primitives.begin(); it != primitives.end(); ++it)
    {
      Eigen::Vector3d location_warped = it[0]->transformation.inverse()*location;
      if( it == primitives.begin() ) d_value = it[0]->signedDistance(location_warped);
      else
      {
        switch(it[0]->operation)
        {
          case bool_union :
            d_value = std::min( it[0]->signedDistance(location_warped), d_value);
          
            break;
          case bool_intersection :
            d_value = std::max( it[0]->signedDistance(location_warped), d_value);
            break;
          
          case bool_subtraction :
            d_value = std::max( -it[0]->signedDistance(location_warped), d_value);
            break;
        } 
      }
    }
    return d_value;
  }